

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

knetFile * kftp_parse_url(char *fn,char *mode)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  bool bVar5;
  char *pcStack_30;
  int l;
  char *p;
  knetFile *fp;
  char *mode_local;
  char *fn_local;
  
  pcVar2 = strstr(fn,"ftp://");
  if (pcVar2 == fn) {
    pcStack_30 = fn + 6;
    while( true ) {
      bVar5 = false;
      if (*pcStack_30 != '\0') {
        bVar5 = *pcStack_30 != '/';
      }
      if (!bVar5) break;
      pcStack_30 = pcStack_30 + 1;
    }
    if (*pcStack_30 == '/') {
      iVar1 = (int)pcStack_30 - (int)fn;
      fn_local = (char *)calloc(1,0x80);
      fn_local[0] = '\x02';
      fn_local[1] = '\0';
      fn_local[2] = '\0';
      fn_local[3] = '\0';
      fn_local[4] = -1;
      fn_local[5] = -1;
      fn_local[6] = -1;
      fn_local[7] = -1;
      pcVar2 = strdup("21");
      *(char **)(fn_local + 0x18) = pcVar2;
      pvVar3 = calloc((long)(iVar1 + -5),1);
      *(void **)(fn_local + 0x10) = pvVar3;
      pcVar2 = strchr(mode,99);
      if (pcVar2 != (char *)0x0) {
        fn_local[0x3c] = '\x01';
        fn_local[0x3d] = '\0';
        fn_local[0x3e] = '\0';
        fn_local[0x3f] = '\0';
      }
      strncpy(*(char **)(fn_local + 0x10),fn + 6,(long)(iVar1 + -6));
      sVar4 = strlen(pcStack_30);
      pvVar3 = calloc(sVar4 + 8,1);
      *(void **)(fn_local + 0x50) = pvVar3;
      sprintf(*(char **)(fn_local + 0x50),"RETR %s\r\n",pcStack_30);
      sVar4 = strlen(pcStack_30);
      pvVar3 = calloc(sVar4 + 8,1);
      *(void **)(fn_local + 0x58) = pvVar3;
      sprintf(*(char **)(fn_local + 0x58),"SIZE %s\r\n",pcStack_30);
      fn_local[0x60] = '\0';
      fn_local[0x61] = '\0';
      fn_local[0x62] = '\0';
      fn_local[99] = '\0';
      fn_local[100] = '\0';
      fn_local[0x65] = '\0';
      fn_local[0x66] = '\0';
      fn_local[0x67] = '\0';
    }
    else {
      fn_local = (char *)0x0;
    }
  }
  else {
    fn_local = (char *)0x0;
  }
  return (knetFile *)fn_local;
}

Assistant:

knetFile *kftp_parse_url(const char *fn, const char *mode)
{
	knetFile *fp;
	char *p;
	int l;
	if (strstr(fn, "ftp://") != fn) return 0;
	for (p = (char*)fn + 6; *p && *p != '/'; ++p);
	if (*p != '/') return 0;
	l = p - fn - 6;
	fp = (knetFile*)calloc(1, sizeof(knetFile));
	fp->type = KNF_TYPE_FTP;
	fp->fd = -1;
	/* the Linux/Mac version of socket_connect() also recognizes a port
	 * like "ftp", but the Windows version does not. */
	fp->port = strdup("21");
	fp->host = (char*)calloc(l + 1, 1);
	if (strchr(mode, 'c')) fp->no_reconnect = 1;
	strncpy(fp->host, fn + 6, l);
	fp->retr = (char*)calloc(strlen(p) + 8, 1);
	sprintf(fp->retr, "RETR %s\r\n", p);
    fp->size_cmd = (char*)calloc(strlen(p) + 8, 1);
    sprintf(fp->size_cmd, "SIZE %s\r\n", p);
	fp->seek_offset = 0;
	return fp;
}